

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

int handle_subfields(FFSBuffer buf,FMFormat_conflict f,estate s,size_t data_offset)

{
  int iVar1;
  long lVar2;
  FMTypeDesc *t;
  long lVar3;
  long lVar4;
  
  if (f->variant != 0) {
    lVar2 = 0x14;
    lVar4 = 0x20;
    for (lVar3 = 0; lVar3 < f->field_count; lVar3 = lVar3 + 1) {
      t = (FMTypeDesc *)((long)&f->var_list->string + lVar4);
      iVar1 = field_is_flat(f,t);
      if ((iVar1 == 0) &&
         (iVar1 = handle_subfield(buf,f,s,(long)*(int *)((long)&f->field_list->field_name + lVar2) +
                                          data_offset,data_offset,t), iVar1 != 1)) {
        return 0;
      }
      lVar2 = lVar2 + 0x18;
      lVar4 = lVar4 + 0x40;
    }
  }
  return 1;
}

Assistant:

static int
handle_subfields(FFSBuffer buf, FMFormat f, estate s, size_t data_offset)
{
    int i;
    /* if base is not variant (I.E. doesn't contain addresses), return;*/
    if (!f->variant) return 1;

    for (i = 0; i < f->field_count; i++) {
	size_t subfield_offset = data_offset + f->field_list[i].field_offset;
	int ret;
	if (field_is_flat(f, &f->var_list[i].type_desc)) continue;
	ret = handle_subfield(buf, f, s, subfield_offset, data_offset, 
			      &f->var_list[i].type_desc);
	if (ret != 1) return 0;
    }
    return 1;
}